

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall Display::checkWindowSize(Display *this)

{
  int field_width;
  bool bVar1;
  int mine_count_00;
  int window_width;
  int window_height;
  int iVar2;
  element_type *peVar3;
  runtime_error *this_00;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  tuple<int&,int&> local_b8 [20];
  undefined1 local_a4 [16];
  int required_height;
  int required_width;
  Minefield local_88;
  int local_1c;
  int local_18;
  int mine_count;
  int minefield_height;
  int minefield_width;
  Display *this_local;
  
  _minefield_height = this;
  mine_count = Controller::getWidth(&this->controller);
  local_18 = Controller::getHeight(&this->controller);
  Controller::getMinefield(&local_88,&this->controller);
  mine_count_00 = Minefield::getMineCount(&local_88);
  Minefield::~Minefield(&local_88);
  field_width = mine_count;
  iVar2 = local_18;
  local_1c = mine_count_00;
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  window_width = (*peVar3->_vptr_IODevice[9])();
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  window_height = (*peVar3->_vptr_IODevice[8])();
  bVar1 = isWindowSizeSufficient(field_width,iVar2,mine_count_00,window_width,window_height);
  if (!bVar1) {
    getRequiredWindowSize((Display *)local_a4,mine_count,local_18,local_1c);
    std::tie<int,int>((int *)local_b8,(int *)(local_a4 + 0xc));
    std::tuple<int&,int&>::operator=(local_b8,(tuple<int,_int> *)local_a4);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_238,local_a4._12_4_);
    std::operator+(&local_218,&local_238,"x");
    std::__cxx11::to_string(&local_258,local_a4._8_4_);
    std::operator+(&local_1f8,&local_218,&local_258);
    std::operator+(&local_1d8,&local_1f8," terminal required to display this ");
    std::__cxx11::to_string(&local_278,mine_count);
    std::operator+(&local_1b8,&local_1d8,&local_278);
    std::operator+(&local_198,&local_1b8,"x");
    std::__cxx11::to_string(&local_298,local_18);
    std::operator+(&local_178,&local_198,&local_298);
    std::operator+(&local_158,&local_178," minefield (Current: ");
    peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->io);
    iVar2 = (*peVar3->_vptr_IODevice[9])();
    std::__cxx11::to_string(&local_2b8,iVar2);
    std::operator+(&local_138,&local_158,&local_2b8);
    std::operator+(&local_118,&local_138,"x");
    peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->io);
    iVar2 = (*peVar3->_vptr_IODevice[8])();
    std::__cxx11::to_string(&local_2d8,iVar2);
    std::operator+(&local_f8,&local_118,&local_2d8);
    std::operator+(&local_d8,&local_f8,")");
    std::runtime_error::runtime_error(this_00,(string *)&local_d8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Display::checkWindowSize() {
    int minefield_width = controller.getWidth();
    int minefield_height = controller.getHeight();
    int mine_count = controller.getMinefield().getMineCount();

    if (!isWindowSizeSufficient(minefield_width, minefield_height, mine_count, io->getWidth(), io->getHeight())) {
        int required_width, required_height;
        std::tie(required_width, required_height) = getRequiredWindowSize(minefield_width, minefield_height, mine_count); 
        throw std::runtime_error(std::to_string(required_width) + "x" + std::to_string(required_height) + " terminal required to display this " + std::to_string(minefield_width) + "x" + std::to_string(minefield_height) + " minefield (Current: " + std::to_string(io->getWidth()) + "x" + std::to_string(io->getHeight()) + ")");
    }
}